

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeTokenMap.cpp
# Opt level: O3

RangeToken * __thiscall
xercesc_4_0::RangeTokenMap::getRange(RangeTokenMap *this,XMLCh *keyword,bool complement)

{
  RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher> *pRVar1;
  RefHashTableOf<xercesc_4_0::RangeFactory,_xercesc_4_0::StringHasher> *pRVar2;
  RangeFactory *pRVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  undefined4 extraout_var;
  RangeToken *pRVar7;
  RefHashTableBucketElem<xercesc_4_0::RangeFactory> *pRVar8;
  XMLCh *pXVar9;
  ushort *puVar10;
  XMLCh XVar11;
  ushort uVar12;
  RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *pRVar13;
  RangeTokenElemMap *pRVar14;
  XMLMutexLock lockInit;
  XMLMutexLock local_40;
  long local_38;
  ushort *key1;
  
  pRVar1 = this->fTokenRegistry;
  if ((keyword == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*keyword, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    XVar11 = keyword[1];
    if (XVar11 != L'\0') {
      pXVar9 = keyword + 2;
      do {
        uVar6 = (ulong)(ushort)XVar11 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar11 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar11 != L'\0');
    }
    uVar6 = uVar6 % pRVar1->fHashModulus;
  }
  pRVar13 = pRVar1->fBucketList[uVar6];
  if (pRVar13 == (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0) {
    return (RangeToken *)0x0;
  }
  while (bVar4 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,keyword,pRVar13->fKey),
        !bVar4) {
    pRVar13 = pRVar13->fNext;
    if (pRVar13 == (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0) {
      return (RangeToken *)0x0;
    }
  }
  pRVar1 = this->fTokenRegistry;
  if ((keyword == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*keyword, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    XVar11 = keyword[1];
    if (XVar11 != L'\0') {
      pXVar9 = keyword + 2;
      do {
        uVar6 = (ulong)(ushort)XVar11 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar11 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar11 != L'\0');
    }
    uVar6 = uVar6 % pRVar1->fHashModulus;
  }
  pRVar13 = pRVar1->fBucketList[uVar6];
  if (pRVar13 == (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0) {
    pRVar14 = (RangeTokenElemMap *)0x0;
  }
  else {
    pRVar14 = (RangeTokenElemMap *)0x0;
    do {
      bVar4 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,keyword,pRVar13->fKey);
      if (bVar4) {
        pRVar14 = pRVar13->fData;
        break;
      }
      pRVar13 = pRVar13->fNext;
    } while (pRVar13 != (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0);
  }
  uVar6 = (ulong)complement;
  if ((&pRVar14->fRange)[uVar6] != (RangeToken *)0x0) {
    return (&pRVar14->fRange)[uVar6];
  }
  XMLMutexLock::XMLMutexLock(&local_40,&this->fMutex);
  pRVar7 = (&pRVar14->fRange)[uVar6];
  if (pRVar7 == (RangeToken *)0x0) {
    local_38 = uVar6 * 8 + 8;
    iVar5 = (*(this->fCategories->super_XSerializable)._vptr_XSerializable[10])
                      (this->fCategories,(ulong)pRVar14->fCategoryId);
    key1 = (ushort *)CONCAT44(extraout_var,iVar5);
    pRVar2 = this->fRangeMap;
    if ((key1 == (ushort *)0x0) || (uVar6 = (ulong)*key1, uVar6 == 0)) {
      uVar6 = 0;
    }
    else {
      uVar12 = key1[1];
      if (uVar12 != 0) {
        puVar10 = key1 + 2;
        do {
          uVar6 = (ulong)uVar12 + (uVar6 >> 0x18) + uVar6 * 0x26;
          uVar12 = *puVar10;
          puVar10 = puVar10 + 1;
        } while (uVar12 != 0);
      }
      uVar6 = uVar6 % pRVar2->fHashModulus;
    }
    pRVar8 = pRVar2->fBucketList[uVar6];
    if (pRVar8 == (RefHashTableBucketElem<xercesc_4_0::RangeFactory> *)0x0) {
LAB_0023a22d:
      pRVar7 = (RangeToken *)0x0;
    }
    else {
      pRVar7 = (RangeToken *)0x0;
      do {
        bVar4 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,key1,pRVar8->fKey);
        if (bVar4) {
          pRVar3 = pRVar8->fData;
          if (pRVar3 == (RangeFactory *)0x0) goto LAB_0023a22d;
          (*pRVar3->_vptr_RangeFactory[3])(pRVar3,this);
          pRVar7 = *(RangeToken **)((long)&pRVar14->fCategoryId + local_38);
          if (complement && pRVar7 == (RangeToken *)0x0) {
            if (pRVar14->fRange == (RangeToken *)0x0) goto LAB_0023a22d;
            pRVar7 = RangeToken::complementRanges
                               (pRVar14->fRange,this->fTokenFactory,
                                this->fTokenRegistry->fMemoryManager);
            pRVar14->fNRange = pRVar7;
          }
          break;
        }
        pRVar8 = pRVar8->fNext;
      } while (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::RangeFactory> *)0x0);
    }
  }
  XMLMutexLock::~XMLMutexLock(&local_40);
  return pRVar7;
}

Assistant:

RangeToken* RangeTokenMap::getRange(const XMLCh* const keyword,
                                    const bool complement) {

    if (!fTokenRegistry->containsKey(keyword))
        return 0;

    RangeTokenElemMap* elemMap = fTokenRegistry->get(keyword);
    RangeToken* rangeTok = elemMap->getRangeToken(complement);

    if (!rangeTok)
    {
        XMLMutexLock lockInit(&fMutex);

        // make sure that it was not created while we were locked
        rangeTok = elemMap->getRangeToken(complement);

        if (!rangeTok)
        {
            unsigned int categId = elemMap->getCategoryId();
            const XMLCh* categName = fCategories->getValueForId(categId);
            RangeFactory* rangeFactory = fRangeMap->get(categName);

            if (rangeFactory)
            {
                rangeFactory->buildRanges(this);
                rangeTok = elemMap->getRangeToken(complement);

                // see if we are complementing an existing range
                if (!rangeTok && complement)
                {
                    rangeTok = elemMap->getRangeToken();
                    if (rangeTok)
                    {
                        rangeTok = RangeToken::complementRanges(rangeTok, fTokenFactory, fTokenRegistry->getMemoryManager());
                        elemMap->setRangeToken(rangeTok , complement);
                    }
                }
            }
        }
    }

    return rangeTok;
}